

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

int * __thiscall agge::raw_memory_object::get_adjust<int>(raw_memory_object *this,count_t size)

{
  uchar *buffer;
  
  buffer = (uchar *)operator_new__((ulong)size);
  if (this->_buffer != (uint8_t *)0x0) {
    operator_delete__(this->_buffer);
  }
  this->_buffer = buffer;
  this->_size = size;
  memset<unsigned_char>(buffer,'\0',size);
  return (int *)this->_buffer;
}

Assistant:

inline T *raw_memory_object::get_adjust(count_t size)
	{
		uint8_t *buffer = new uint8_t[size];

		delete []_buffer;
		_buffer = buffer;
		_size = size;
		memset(buffer, uint8_t(), size);
		return reinterpret_cast<T *>(_buffer);
	}